

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O2

string * __thiscall
MADPComponentDiscreteStates::SoftPrintInitialStateDistribution_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteStates *this)

{
  ostream *poVar1;
  E *this_00;
  stringstream ss;
  ostream local_188 [376];
  
  if (this->_m_initialized != false) {
    (*(this->_m_initialStateDistribution->super_StateDistribution)._vptr_StateDistribution[6])();
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_188,"MADPComponentDiscreteStates::PrintInitialStateDistribution(");
  poVar1 = std::operator<<(poVar1,") - Error: not initialized. ");
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

string MADPComponentDiscreteStates::SoftPrintInitialStateDistribution() const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteStates::PrintInitialStateDistribution("<< 
        ") - Error: not initialized. " <<endl;
        throw E(ss);
    }
    return(_m_initialStateDistribution->SoftPrint());
}